

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cpp
# Opt level: O0

int anon_unknown.dwarf_ab2::DetectOfficialF0CandidatesSub1
              (int *vuv,int number_of_channels,int *st,int *ed)

{
  int iVar1;
  int iVar2;
  int local_34;
  int i;
  int tmp;
  int number_of_voiced_sections;
  int *ed_local;
  int *st_local;
  int number_of_channels_local;
  int *vuv_local;
  
  i = 0;
  for (local_34 = 1; local_34 < number_of_channels; local_34 = local_34 + 1) {
    iVar1 = vuv[local_34];
    iVar2 = vuv[local_34 + -1];
    if (iVar1 - iVar2 == 1) {
      st[i] = local_34;
    }
    if (iVar1 - iVar2 == -1) {
      ed[i] = local_34;
      i = i + 1;
    }
  }
  return i;
}

Assistant:

static int DetectOfficialF0CandidatesSub1(const int *vuv,
    int number_of_channels, int *st, int *ed) {
  int number_of_voiced_sections = 0;
  int tmp;
  for (int i = 1; i < number_of_channels; ++i) {
    tmp = vuv[i] - vuv[i - 1];
    if (tmp == 1) st[number_of_voiced_sections] = i;
    if (tmp == -1) ed[number_of_voiced_sections++] = i;
  }

  return number_of_voiced_sections;
}